

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

tm * __thiscall
absl::lts_20250127::ToTM
          (tm *__return_storage_ptr__,lts_20250127 *this,uint32_t param_3,undefined8 param_4)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Time t;
  CivilInfo ci;
  undefined8 local_50;
  CivilInfo local_48;
  
  *(undefined8 *)&__return_storage_ptr__->tm_isdst = 0;
  __return_storage_ptr__->tm_gmtoff = 0;
  __return_storage_ptr__->tm_mon = 0;
  __return_storage_ptr__->tm_year = 0;
  __return_storage_ptr__->tm_wday = 0;
  __return_storage_ptr__->tm_yday = 0;
  __return_storage_ptr__->tm_sec = 0;
  __return_storage_ptr__->tm_min = 0;
  __return_storage_ptr__->tm_hour = 0;
  __return_storage_ptr__->tm_mday = 0;
  __return_storage_ptr__->tm_zone = (char *)0x0;
  t.rep_.rep_lo_ = param_3;
  t.rep_.rep_hi_ = (HiRep)this;
  local_50 = param_4;
  TimeZone::At(&local_48,(TimeZone *)&local_50,t);
  __return_storage_ptr__->tm_sec = (int)local_48.cs.f_.ss;
  __return_storage_ptr__->tm_min = (int)local_48.cs.f_.mm;
  __return_storage_ptr__->tm_hour = (int)local_48.cs.f_.hh;
  __return_storage_ptr__->tm_mday = (int)local_48.cs.f_.d;
  __return_storage_ptr__->tm_mon = local_48.cs.f_.m + -1;
  iVar1 = -0x80000000;
  if ((-0x7ffff895 < local_48.cs.f_.y) && (iVar1 = 0x7ffff893, local_48.cs.f_.y < 0x80000000)) {
    iVar1 = (int)local_48.cs.f_.y + -0x76c;
  }
  __return_storage_ptr__->tm_year = iVar1;
  uVar3 = (local_48.cs.f_.y % 400 - (ulong)(local_48.cs.f_.m < '\x03')) + 0x960;
  __return_storage_ptr__->tm_wday =
       *(int *)(&DAT_004af854 +
               (long)*(int *)(&DAT_004af778 +
                             ((long)((long)local_48.cs.f_.d +
                                     (long)*(int *)(&DAT_004af7a0 + (long)local_48.cs.f_.m * 4) +
                                     uVar3 / 400 + (uVar3 >> 2) + (uVar3 - (uVar3 >> 2) / 0x19)) % 7
                             ) * 4) * 4);
  uVar2 = 0;
  if ((local_48.cs.f_.m >= '\x03' && (local_48.cs.f_.y & 3U) == 0) &&
     (uVar2 = 1,
     (local_48.cs.f_.y * -0x70a3d70a3d70a3d7 + 0x51eb851eb851eb8U >> 2 |
     local_48.cs.f_.y * -0x70a3d70a3d70a3d7 << 0x3e) < 0x28f5c28f5c28f5d)) {
    uVar2 = (uint)(local_48.cs.f_.y % 400 == 0);
  }
  __return_storage_ptr__->tm_yday =
       *(int *)(&DAT_004af7e0 + (long)local_48.cs.f_.m * 4) + (int)local_48.cs.f_.d + uVar2 + -1;
  __return_storage_ptr__->tm_isdst = (uint)local_48.is_dst;
  return __return_storage_ptr__;
}

Assistant:

struct tm ToTM(absl::Time t, absl::TimeZone tz) {
  struct tm tm = {};

  const auto ci = tz.At(t);
  const auto& cs = ci.cs;
  tm.tm_sec = cs.second();
  tm.tm_min = cs.minute();
  tm.tm_hour = cs.hour();
  tm.tm_mday = cs.day();
  tm.tm_mon = cs.month() - 1;

  // Saturates tm.tm_year in cases of over/underflow, accounting for the fact
  // that tm.tm_year is years since 1900.
  if (cs.year() < std::numeric_limits<int>::min() + 1900) {
    tm.tm_year = std::numeric_limits<int>::min();
  } else if (cs.year() > std::numeric_limits<int>::max()) {
    tm.tm_year = std::numeric_limits<int>::max() - 1900;
  } else {
    tm.tm_year = static_cast<int>(cs.year() - 1900);
  }

  switch (GetWeekday(cs)) {
    case Weekday::sunday:
      tm.tm_wday = 0;
      break;
    case Weekday::monday:
      tm.tm_wday = 1;
      break;
    case Weekday::tuesday:
      tm.tm_wday = 2;
      break;
    case Weekday::wednesday:
      tm.tm_wday = 3;
      break;
    case Weekday::thursday:
      tm.tm_wday = 4;
      break;
    case Weekday::friday:
      tm.tm_wday = 5;
      break;
    case Weekday::saturday:
      tm.tm_wday = 6;
      break;
  }
  tm.tm_yday = GetYearDay(cs) - 1;
  tm.tm_isdst = ci.is_dst ? 1 : 0;

  return tm;
}